

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

State * __thiscall
bas::Vector<State,_4UL,_bas::RawAllocator>::pop_last
          (State *__return_storage_ptr__,Vector<State,_4UL,_bas::RawAllocator> *this)

{
  bool bVar1;
  Vector<State,_4UL,_bas::RawAllocator> *this_local;
  State *value;
  
  bVar1 = is_empty(this);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    this->m_end = this->m_end + -1;
    State::State(__return_storage_ptr__,this->m_end);
    destruct<State>(this->m_end);
    this->m_debug_size = ((long)this->m_end - (long)this->m_begin) / 0x78;
    return __return_storage_ptr__;
  }
  __assert_fail("!this->is_empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/bas/include/bas/vector.h"
                ,0x1a1,
                "T bas::Vector<State>::pop_last() [T = State, N = 4, Allocator = bas::RawAllocator]"
               );
}

Assistant:

T pop_last()
    {
        assert(!this->is_empty());
        m_end--;
        T value = std::move(*m_end);
        destruct(m_end);
        UPDATE_VECTOR_SIZE(this);
        return value;
    }